

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintNumberUnsigned(_U_UINT number)

{
  bool bVar1;
  _U_UINT divisor;
  ulong uVar2;
  
  for (uVar2 = 1; 9 < number / uVar2; uVar2 = uVar2 * 10) {
  }
  do {
    putchar((uint)((number / uVar2) % 10) | 0x30);
    bVar1 = 9 < uVar2;
    uVar2 = uVar2 / 10;
  } while (bVar1);
  return;
}

Assistant:

void UnityPrintNumberUnsigned(const _U_UINT number)
{
    _U_UINT divisor = 1;

    /* figure out initial divisor */
    while (number / divisor > 9)
    {
        divisor *= 10;
    }

    /* now mod and print, then divide divisor */
    do
    {
        UNITY_OUTPUT_CHAR((char)('0' + (number / divisor % 10)));
        divisor /= 10;
    }
    while (divisor > 0);
}